

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_union_vec_ref_t
flatcc_builder_create_union_vector
          (flatcc_builder_t *B,flatcc_builder_union_ref_t *urefs,size_t count)

{
  int iVar1;
  flatcc_builder_ref_t *pfVar2;
  flatcc_builder_utype_t *types_00;
  ulong local_40;
  size_t i;
  flatcc_builder_ref_t *refs;
  flatcc_builder_utype_t *types;
  size_t count_local;
  flatcc_builder_union_ref_t *urefs_local;
  flatcc_builder_t *B_local;
  flatcc_builder_union_vec_ref_t uvref;
  
  memset(&B_local,0,8);
  iVar1 = flatcc_builder_start_offset_vector(B);
  if (((iVar1 == 0) &&
      (pfVar2 = flatcc_builder_extend_offset_vector(B,count), pfVar2 != (flatcc_builder_ref_t *)0x0)
      ) && (types_00 = (flatcc_builder_utype_t *)push_ds(B,(flatbuffers_uoffset_t)count),
           types_00 != (flatcc_builder_utype_t *)0x0)) {
    pfVar2 = (flatcc_builder_ref_t *)flatcc_builder_offset_vector_edit(B);
    for (local_40 = 0; local_40 < count; local_40 = local_40 + 1) {
      types_00[local_40] = urefs[local_40].type;
      pfVar2[local_40] = urefs[local_40].value;
    }
    B_local = (flatcc_builder_t *)flatcc_builder_create_union_vector_direct(B,types_00,pfVar2,count)
    ;
    exit_frame(B);
  }
  return (flatcc_builder_union_vec_ref_t)B_local;
}

Assistant:

flatcc_builder_union_vec_ref_t flatcc_builder_create_union_vector(flatcc_builder_t *B,
        const flatcc_builder_union_ref_t *urefs, size_t count)
{
    flatcc_builder_union_vec_ref_t uvref = { 0, 0 };
    flatcc_builder_utype_t *types;
    flatcc_builder_ref_t *refs;
    size_t i;

    if (flatcc_builder_start_offset_vector(B)) {
        return uvref;
    }
    if (0 == flatcc_builder_extend_offset_vector(B, count)) {
        return uvref;
    }
    if (0 == (types = push_ds(B, (uoffset_t)(utype_size * count)))) {
        return uvref;
    }

    /* Safe even if push_ds caused stack reallocation. */
    refs = flatcc_builder_offset_vector_edit(B);

    for (i = 0; i < count; ++i) {
        types[i] = urefs[i].type;
        refs[i] = urefs[i].value;
    }
    uvref = flatcc_builder_create_union_vector_direct(B,
            types, refs, count);
    /* No need to clean up after out temporary types vector. */
    exit_frame(B);
    return uvref;
}